

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classloader.cpp
# Opt level: O3

void __thiscall
stackjit::ClassLoader::defineClasses
          (ClassLoader *this,
          vector<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_> *classes)

{
  pointer pcVar1;
  VMState *pVVar2;
  pointer ppVar3;
  bool bVar4;
  int iVar5;
  ClassMetadataProvider *pCVar6;
  string *psVar7;
  string *psVar8;
  ClassMetadata *pCVar9;
  ClassType *parentClass;
  ClassType *subClass;
  runtime_error *prVar10;
  long *plVar11;
  size_type *psVar12;
  long *plVar13;
  pointer ppVar14;
  pointer this_00;
  string thisName;
  string parentName;
  vector<std::pair<stackjit::ClassMetadata_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<stackjit::ClassMetadata_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  inheritingClasses;
  string local_2a0;
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  undefined1 auStack_260 [8];
  vector<std::pair<stackjit::ClassMetadata_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<stackjit::ClassMetadata_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_258;
  pointer local_238;
  string local_230;
  string local_210;
  undefined1 local_1f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  long *local_1b0;
  __node_base_ptr local_1a8;
  long local_1a0;
  long lStack_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  ClassMetadata local_150;
  
  local_258.
  super__Vector_base<std::pair<stackjit::ClassMetadata_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<stackjit::ClassMetadata_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_258.
  super__Vector_base<std::pair<stackjit::ClassMetadata_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<stackjit::ClassMetadata_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_258.
  super__Vector_base<std::pair<stackjit::ClassMetadata_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<stackjit::ClassMetadata_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (classes->
            super__Vector_base<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_>).
            _M_impl.super__Vector_impl_data._M_start;
  local_238 = (classes->
              super__Vector_base<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_>)
              ._M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != local_238) {
    do {
      pCVar6 = VMState::classProvider(this->mVMState);
      psVar7 = Loader::Class::name_abi_cxx11_(this_00);
      bVar4 = ClassMetadataProvider::isDefined(pCVar6,psVar7);
      if (bVar4) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        psVar7 = Loader::Class::name_abi_cxx11_(this_00);
        std::operator+(&local_2a0,"The class \'",psVar7);
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_2a0);
        local_280._0_8_ = *plVar11;
        pCVar9 = (ClassMetadata *)(plVar11 + 2);
        if ((ClassMetadata *)local_280._0_8_ == pCVar9) {
          local_270._0_8_ = (pCVar9->mName)._M_dataplus._M_p;
          local_270._8_8_ = plVar11[3];
          local_280._0_8_ = (ClassMetadata *)local_270;
        }
        else {
          local_270._0_8_ = (pCVar9->mName)._M_dataplus._M_p;
        }
        local_280._8_8_ = plVar11[1];
        *plVar11 = (long)pCVar9;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        std::runtime_error::runtime_error(prVar10,(string *)local_280);
        __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pCVar6 = VMState::classProvider(this->mVMState);
      psVar7 = Loader::Class::name_abi_cxx11_(this_00);
      psVar8 = Loader::Class::name_abi_cxx11_(this_00);
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      pcVar1 = (psVar8->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_230,pcVar1,pcVar1 + psVar8->_M_string_length);
      ClassMetadata::ClassMetadata(&local_150,&local_230);
      ClassMetadataProvider::add(pCVar6,psVar7,&local_150);
      ClassMetadata::~ClassMetadata(&local_150);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p);
      }
      Loader::Class::parentClassName_abi_cxx11_((string *)local_280,this_00);
      iVar5 = std::__cxx11::string::compare((char *)local_280);
      if ((ClassMetadata *)local_280._0_8_ != (ClassMetadata *)local_270) {
        operator_delete((void *)local_280._0_8_);
      }
      if (iVar5 != 0) {
        pCVar6 = VMState::classProvider(this->mVMState);
        psVar7 = Loader::Class::name_abi_cxx11_(this_00);
        pCVar9 = ClassMetadataProvider::getMetadata(pCVar6,psVar7);
        Loader::Class::parentClassName_abi_cxx11_(&local_2a0,this_00);
        local_280._8_8_ = local_270 + 8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_dataplus._M_p == &local_2a0.field_2) {
          auStack_260 = (undefined1  [8])local_2a0.field_2._8_8_;
        }
        else {
          local_280._8_8_ = local_2a0._M_dataplus._M_p;
        }
        local_270._9_7_ = local_2a0.field_2._M_allocated_capacity._1_7_;
        local_270[8] = local_2a0.field_2._M_local_buf[0];
        local_270._0_8_ = local_2a0._M_string_length;
        local_2a0._M_string_length = 0;
        local_2a0.field_2._M_local_buf[0] = '\0';
        local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
        local_280._0_8_ = pCVar9;
        std::
        vector<std::pair<stackjit::ClassMetadata*,std::__cxx11::string>,std::allocator<std::pair<stackjit::ClassMetadata*,std::__cxx11::string>>>
        ::emplace_back<std::pair<stackjit::ClassMetadata*,std::__cxx11::string>>
                  ((vector<std::pair<stackjit::ClassMetadata*,std::__cxx11::string>,std::allocator<std::pair<stackjit::ClassMetadata*,std::__cxx11::string>>>
                    *)&local_258,
                   (pair<stackjit::ClassMetadata_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_280);
        if ((undefined1 *)local_280._8_8_ != local_270 + 8) {
          operator_delete((void *)local_280._8_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
          operator_delete(local_2a0._M_dataplus._M_p);
        }
      }
      ppVar3 = local_258.
               super__Vector_base<std::pair<stackjit::ClassMetadata_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<stackjit::ClassMetadata_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      this_00 = this_00 + 1;
    } while (this_00 != local_238);
    if (local_258.
        super__Vector_base<std::pair<stackjit::ClassMetadata_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<stackjit::ClassMetadata_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_258.
        super__Vector_base<std::pair<stackjit::ClassMetadata_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<stackjit::ClassMetadata_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      ppVar14 = local_258.
                super__Vector_base<std::pair<stackjit::ClassMetadata_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<stackjit::ClassMetadata_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        pVVar2 = this->mVMState;
        local_1f0._0_8_ = local_1f0 + 0x10;
        pcVar1 = (ppVar14->second)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1f0,pcVar1,pcVar1 + (ppVar14->second)._M_string_length);
        parentClass = LoaderHelpers::getClassType(pVVar2,(string *)local_1f0);
        if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
          operator_delete((void *)local_1f0._0_8_);
        }
        pVVar2 = this->mVMState;
        psVar7 = ClassMetadata::name_abi_cxx11_(ppVar14->first);
        local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
        pcVar1 = (psVar7->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_210,pcVar1,pcVar1 + psVar7->_M_string_length);
        subClass = LoaderHelpers::getClassType(pVVar2,&local_210);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p);
        }
        if (parentClass == subClass) {
          prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
          psVar7 = ClassMetadata::name_abi_cxx11_(ppVar14->first);
          std::operator+(&local_2a0,"Self inheritance is not allowed (",psVar7);
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_2a0);
          local_280._0_8_ = *plVar11;
          pCVar9 = (ClassMetadata *)(plVar11 + 2);
          if ((ClassMetadata *)local_280._0_8_ == pCVar9) {
            local_270._0_8_ = (pCVar9->mName)._M_dataplus._M_p;
            local_270._8_8_ = plVar11[3];
            local_280._0_8_ = (ClassMetadata *)local_270;
          }
          else {
            local_270._0_8_ = (pCVar9->mName)._M_dataplus._M_p;
          }
          local_280._8_8_ = plVar11[1];
          *plVar11 = (long)pCVar9;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          std::runtime_error::runtime_error(prVar10,(string *)local_280);
          __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        ClassMetadata::setParentClass(ppVar14->first,parentClass);
        bVar4 = TypeSystem::isSubtypeOf(parentClass,subClass);
        if (bVar4) {
          bVar4 = TypeSystem::isSubtypeOf(subClass,parentClass);
          if (bVar4) {
            psVar7 = ClassType::className_abi_cxx11_(parentClass);
            local_280._0_8_ = local_270;
            pcVar1 = (psVar7->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_280,pcVar1,pcVar1 + psVar7->_M_string_length);
            psVar7 = ClassType::className_abi_cxx11_(subClass);
            local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
            pcVar1 = (psVar7->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_2a0,pcVar1,pcVar1 + psVar7->_M_string_length);
            bVar4 = std::operator>((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_280,&local_2a0);
            if (bVar4) {
              std::__cxx11::string::swap((string *)local_280);
            }
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::operator+(&local_190,"Mutual inheritance is not allowed (",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_280);
            plVar11 = (long *)std::__cxx11::string::append((char *)&local_190);
            local_1d0._M_dataplus._M_p = (pointer)*plVar11;
            psVar12 = (size_type *)(plVar11 + 2);
            if ((size_type *)local_1d0._M_dataplus._M_p == psVar12) {
              local_1d0.field_2._M_allocated_capacity = *psVar12;
              local_1d0.field_2._8_8_ = plVar11[3];
              local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
            }
            else {
              local_1d0.field_2._M_allocated_capacity = *psVar12;
            }
            local_1d0._M_string_length = plVar11[1];
            *plVar11 = (long)psVar12;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            std::operator+(&local_170,&local_1d0,&local_2a0);
            plVar11 = (long *)std::__cxx11::string::append((char *)&local_170);
            local_1b0 = (long *)*plVar11;
            plVar13 = plVar11 + 2;
            if (local_1b0 == plVar13) {
              local_1a0 = *plVar13;
              lStack_198 = plVar11[3];
              local_1b0 = &local_1a0;
            }
            else {
              local_1a0 = *plVar13;
            }
            local_1a8 = (__node_base_ptr)plVar11[1];
            *plVar11 = (long)plVar13;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            std::runtime_error::runtime_error(prVar10,(string *)&local_1b0);
            __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
        }
        ppVar14 = ppVar14 + 1;
      } while (ppVar14 != ppVar3);
    }
  }
  std::
  vector<std::pair<stackjit::ClassMetadata_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<stackjit::ClassMetadata_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_258);
  return;
}

Assistant:

void ClassLoader::loadClasses(ImageContainer& imageContainer) {
		std::vector<Loader::Class> classes;
		forEachClass(imageContainer, [&](const stackjit::Loader::Class& classDef) {
			imageContainer.loadClassBody(classDef.name());
			classes.push_back(classDef);
		});

		loadClasses(classes);
	}